

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsbox.cpp
# Opt level: O0

void __thiscall
libsbox::Stream::
deserialize_request<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
          (Stream *this,Value *value)

{
  bool bVar1;
  ContextManager *pCVar2;
  Ch *pCVar3;
  allocator<char> local_71;
  string local_70 [55];
  allocator<char> local_39;
  string local_38 [32];
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *local_18;
  Value *value_local;
  Stream *this_local;
  
  local_18 = value;
  value_local = (Value *)this;
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsNull(value);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)this,"");
  }
  else {
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsString(local_18);
    if (!bVar1) {
      pCVar2 = ContextManager::get();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_38,"JSON is incorrect",&local_39);
      (*(code *)**(undefined8 **)pCVar2)(pCVar2,local_38);
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator(&local_39);
    }
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsString(local_18);
    if (!bVar1) {
      pCVar2 = ContextManager::get();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_70,"JSON is incorrect",&local_71);
      (*(code *)**(undefined8 **)pCVar2)(pCVar2,local_70);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator(&local_71);
    }
    pCVar3 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(local_18);
    std::__cxx11::string::operator=((string *)this,pCVar3);
  }
  return;
}

Assistant:

void Stream::deserialize_request(const rapidjson::Value &value) {
    if (value.IsNull()) {
        filename_ = "";
    } else {
        CHECK_TYPE(value, String);
        GET(filename_, value, String);
    }
}